

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_bsp.cpp
# Opt level: O3

void R_RenderBSPNode(void *node)

{
  bool bVar1;
  ulong uVar2;
  short *psVar3;
  int iVar4;
  float *pfVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  long lVar9;
  short *psVar10;
  subsector_t *sub;
  bool bVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  
  sub = subsectors;
  if (numnodes != 0) {
    uVar2 = (ulong)node & 1;
    while (uVar2 == 0) {
      lVar9 = (long)*(int *)((long)node + 0xc) *
              ((long)*node - (long)SUB84(ViewPos.X + 103079215104.0,0)) +
              (long)*(int *)((long)node + 8) *
              ((long)SUB84(ViewPos.Y + 103079215104.0,0) - (long)*(int *)((long)node + 4));
      bVar11 = (int)((ulong)lVar9 >> 0x20) == 0;
      bVar1 = bVar11 || lVar9 < 0;
      R_RenderBSPNode(*(void **)((long)node + ((ulong)(!bVar11 && lVar9 >= 0) * 2 + 0xe) * 4));
      pfVar5 = (float *)((long)node + ((ulong)bVar1 * 4 + 4) * 4);
      uVar6 = 0;
      uVar8 = 0;
      if ((double)*(float *)((long)node + ((ulong)bVar1 * 4 + 6) * 4) < ViewPos.X) {
        uVar8 = 2 - (ViewPos.X < (double)*(float *)((long)node + ((ulong)bVar1 * 4 + 7) * 4));
      }
      if (ViewPos.Y < (double)*pfVar5) {
        uVar6 = (uint)(ViewPos.Y <= (double)*(float *)((long)node + ((ulong)bVar1 * 4 + 5) * 4)) * 4
                + 4;
      }
      uVar6 = uVar6 | uVar8;
      if (uVar6 != 5) {
        dVar16 = (double)pfVar5[checkcoord[uVar6][0]] - ViewPos.X;
        dVar17 = (double)pfVar5[checkcoord[uVar6][1]] - ViewPos.Y;
        if (((double)pfVar5[checkcoord[uVar6][0]] - (double)pfVar5[checkcoord[uVar6][2]]) * dVar17 +
            ((double)pfVar5[checkcoord[uVar6][3]] - (double)pfVar5[checkcoord[uVar6][1]]) * dVar16 <
            -1.52587890625e-05) {
          dVar15 = (double)pfVar5[checkcoord[uVar6][3]] - ViewPos.Y;
          dVar14 = (double)pfVar5[checkcoord[uVar6][2]] - ViewPos.X;
          dVar12 = ViewSin * dVar14 - ViewCos * dVar15;
          dVar13 = ViewSin * dVar16 - ViewCos * dVar17;
          dVar15 = ViewTanSin * dVar15 + ViewTanCos * dVar14;
          dVar17 = ViewTanSin * dVar17 + ViewTanCos * dVar16;
          dVar16 = dVar15;
          if (((byte)MirrorFlags & 1) != 0) {
            dVar16 = -dVar13;
            dVar13 = -dVar12;
            dVar12 = dVar16;
            dVar16 = dVar17;
            dVar17 = dVar15;
          }
          if (-dVar17 <= dVar13) {
            if (dVar17 < dVar13) {
              return;
            }
            if (dVar17 == 0.0) {
              return;
            }
            iVar4 = SUB84(CenterX + 6755399441055744.0 + (CenterX * dVar13) / dVar17,0);
          }
          else {
            if (dVar12 < -dVar16) {
              return;
            }
            iVar4 = 0;
            if (dVar13 + dVar17 == dVar12 + dVar16) {
              return;
            }
          }
          if (dVar12 <= dVar16) {
            if (dVar12 < -dVar16) {
              return;
            }
            if (dVar16 == 0.0) {
              return;
            }
            iVar7 = SUB84(CenterX + 6755399441055744.0 + (dVar12 * CenterX) / dVar16,0);
          }
          else {
            if (dVar17 < dVar13) {
              return;
            }
            iVar7 = viewwidth;
            if (dVar13 + dVar16 == dVar12 + dVar17) {
              return;
            }
          }
          if (iVar7 <= iVar4) {
            return;
          }
          psVar3 = &solidsegs[0].last;
          do {
            psVar10 = psVar3;
            psVar3 = psVar10 + 2;
          } while (*psVar10 < iVar7);
          if (((cliprange_t *)(psVar10 + -1))->first <= iVar4) {
            return;
          }
        }
      }
      node = *(void **)((long)node + ((ulong)bVar1 * 2 + 0xe) * 4);
      uVar2 = (ulong)node & 1;
    }
    sub = (subsector_t *)((long)node + -1);
  }
  R_Subsector(sub);
  return;
}

Assistant:

void R_RenderBSPNode (void *node)
{
	if (numnodes == 0)
	{
		R_Subsector (subsectors);
		return;
	}
	while (!((size_t)node & 1))  // Keep going until found a subsector
	{
		node_t *bsp = (node_t *)node;

		// Decide which side the view point is on.
		int side = R_PointOnSide (ViewPos, bsp);

		// Recursively divide front space (toward the viewer).
		R_RenderBSPNode (bsp->children[side]);

		// Possibly divide back space (away from the viewer).
		side ^= 1;
		if (!R_CheckBBox (bsp->bbox[side]))
			return;

		node = bsp->children[side];
	}
	R_Subsector ((subsector_t *)((BYTE *)node - 1));
}